

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

MessagePattern * __thiscall
icu_63::MessagePattern::operator=(MessagePattern *this,MessagePattern *other)

{
  UBool UVar1;
  uint in_EAX;
  UErrorCode errorCode;
  undefined8 uStack_18;
  
  if (this != other) {
    this->aposMode = other->aposMode;
    uStack_18._0_4_ = in_EAX;
    UnicodeString::operator=(&this->msg,&other->msg);
    this->hasArgNames = other->hasArgNames;
    this->hasArgNumbers = other->hasArgNumbers;
    this->needsAutoQuoting = other->needsAutoQuoting;
    uStack_18 = (ulong)(uint)uStack_18;
    UVar1 = copyStorage(this,other,(UErrorCode *)((long)&uStack_18 + 4));
    if (UVar1 == '\0') {
      clear(this);
    }
  }
  return this;
}

Assistant:

MessagePattern &
MessagePattern::operator=(const MessagePattern &other) {
    if(this==&other) {
        return *this;
    }
    aposMode=other.aposMode;
    msg=other.msg;
    hasArgNames=other.hasArgNames;
    hasArgNumbers=other.hasArgNumbers;
    needsAutoQuoting=other.needsAutoQuoting;
    UErrorCode errorCode=U_ZERO_ERROR;
    if(!copyStorage(other, errorCode)) {
        clear();
    }
    return *this;
}